

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O2

pboolean p_tree_rb_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                         pconstpointer key)

{
  PTreeBaseNode_ *pPVar1;
  PTreeBaseNode_ *pPVar2;
  ppointer pvVar3;
  bool bVar4;
  pint pVar5;
  PTreeRBNode *node;
  PTreeRBNode_ *pPVar6;
  PTreeRBNode *pPVar7;
  PTreeRBNode *pPVar8;
  PTreeRBNode *pPVar9;
  PTreeRBNode *mem;
  
  pPVar8 = (PTreeRBNode *)root_node;
  while( true ) {
    do {
      pPVar8 = (PTreeRBNode *)(pPVar8->base).left;
      if (pPVar8 == (PTreeRBNode *)0x0) {
        return 0;
      }
      pVar5 = (*compare_func)(key,(pPVar8->base).key,data);
    } while (pVar5 < 0);
    if (pVar5 == 0) break;
    pPVar8 = (PTreeRBNode *)&(pPVar8->base).right;
  }
  pPVar9 = (PTreeRBNode *)(pPVar8->base).left;
  mem = pPVar8;
  if (pPVar9 == (PTreeRBNode *)0x0) {
LAB_00114493:
    pPVar9 = (PTreeRBNode *)(mem->base).right;
    if (pPVar9 == (PTreeRBNode *)0x0) {
      bVar4 = true;
      if ((mem->color & P_TREE_RB_COLOR_BLACK) != 0) {
        pPVar9 = (PTreeRBNode *)0x0;
        pPVar8 = mem;
        do {
          pPVar6 = pPVar8->parent;
          if (pPVar6 == (PTreeRBNode *)0x0) goto LAB_001145fe;
          pPVar7 = (PTreeRBNode *)(pPVar6->base).left;
          node = pPVar7;
          if (pPVar7 == pPVar8) {
            node = (PTreeRBNode *)(pPVar6->base).right;
          }
          if ((node->color & P_TREE_RB_COLOR_RED) != 0) {
            pPVar6->color = P_TREE_RB_COLOR_RED;
            node->color = P_TREE_RB_COLOR_BLACK;
            if (pPVar7 == pPVar8) {
              pp_tree_rb_rotate_left(pPVar6,root_node);
            }
            else {
              pp_tree_rb_rotate_right(pPVar6,root_node);
            }
            pPVar6 = pPVar8->parent;
            node = (PTreeRBNode *)(pPVar6->base).left;
            pPVar7 = node;
            if (node == pPVar8) {
              node = (PTreeRBNode *)(pPVar6->base).right;
              pPVar7 = pPVar8;
            }
          }
          pPVar1 = (node->base).left;
          if (((pPVar1 != (PTreeBaseNode_ *)0x0) && (((ulong)pPVar1[1].right & 2) == 0)) ||
             ((pPVar2 = (node->base).right, pPVar2 != (PTreeBaseNode_ *)0x0 &&
              (((ulong)pPVar2[1].right & 2) == 0)))) {
            if ((pPVar8 == pPVar7) &&
               ((pPVar2 = (node->base).right, pPVar2 == (PTreeBaseNode_ *)0x0 ||
                (((ulong)pPVar2[1].right & 2) != 0)))) {
              node->color = P_TREE_RB_COLOR_RED;
              *(undefined4 *)&pPVar1[1].right = 2;
              pp_tree_rb_rotate_right(node,root_node);
LAB_001145ac:
              pPVar6 = pPVar8->parent;
              node = (PTreeRBNode *)(pPVar6->base).left;
              pPVar7 = node;
              if (node == pPVar8) {
                node = (PTreeRBNode *)(pPVar6->base).right;
                pPVar7 = pPVar8;
              }
            }
            else if ((pPVar8 == (PTreeRBNode *)(pPVar6->base).right) &&
                    ((pPVar1 == (PTreeBaseNode_ *)0x0 || (((ulong)pPVar1[1].right & 2) != 0)))) {
              node->color = P_TREE_RB_COLOR_RED;
              *(undefined4 *)&(node->base).right[1].right = 2;
              pp_tree_rb_rotate_left(node,root_node);
              goto LAB_001145ac;
            }
            node->color = pPVar6->color;
            pPVar6->color = P_TREE_RB_COLOR_BLACK;
            if (pPVar8 == pPVar7) {
              *(undefined4 *)&(node->base).right[1].right = 2;
              pp_tree_rb_rotate_left(pPVar6,root_node);
            }
            else {
              *(undefined4 *)&(node->base).left[1].right = 2;
              pp_tree_rb_rotate_right(pPVar6,root_node);
            }
            goto LAB_001145fb;
          }
          node->color = P_TREE_RB_COLOR_RED;
          pPVar8 = pPVar6;
        } while ((pPVar6->color & P_TREE_RB_COLOR_BLACK) != 0);
        pPVar6->color = P_TREE_RB_COLOR_BLACK;
      }
LAB_001145fb:
      pPVar9 = (PTreeRBNode *)0x0;
      goto LAB_001145fe;
    }
  }
  else if ((pPVar8->base).right != (PTreeBaseNode_ *)0x0) {
    do {
      mem = pPVar9;
      pPVar9 = (PTreeRBNode *)(mem->base).right;
    } while (pPVar9 != (PTreeRBNode *)0x0);
    pvVar3 = (mem->base).value;
    (pPVar8->base).key = (mem->base).key;
    (pPVar8->base).value = pvVar3;
    pPVar9 = (PTreeRBNode *)(mem->base).left;
    if (pPVar9 != (PTreeRBNode *)0x0) {
      bVar4 = false;
      goto LAB_001145fe;
    }
    goto LAB_00114493;
  }
  bVar4 = false;
LAB_001145fe:
  if (mem == (PTreeRBNode *)*root_node) {
    pPVar6 = (PTreeRBNode_ *)0x0;
  }
  else {
    pPVar6 = mem->parent;
    root_node = &(pPVar6->base).left + ((PTreeRBNode *)(pPVar6->base).left != mem);
  }
  *root_node = &pPVar9->base;
  if ((!bVar4) && (pPVar9->parent = pPVar6, (mem->color & P_TREE_RB_COLOR_BLACK) != 0)) {
    pPVar9->color = P_TREE_RB_COLOR_BLACK;
  }
  if (key_destroy_func != (PDestroyFunc)0x0) {
    (*key_destroy_func)((mem->base).key);
  }
  if (value_destroy_func != (PDestroyFunc)0x0) {
    (*value_destroy_func)((mem->base).value);
  }
  p_free(mem);
  return 1;
}

Assistant:

pboolean
p_tree_rb_remove (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  pconstpointer		key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	*child_node;
	PTreeRBNode	*child_parent;
	pint		cmp_result;

	cur_node = *root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		prev_node = cur_node->left;

		while (prev_node->right != NULL)
			prev_node = prev_node->right;

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		/* Mark node for removal */
		cur_node = prev_node;
	}

	child_node = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (child_node == NULL && pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
		pp_tree_rb_balance_remove ((PTreeRBNode *) cur_node, root_node);

	/* Replace node with its child */
	if (cur_node == *root_node) {
		*root_node   = child_node;
		child_parent = NULL;
	} else {
		child_parent = ((PTreeRBNode *) cur_node)->parent;

		if (child_parent->base.left == cur_node)
			child_parent->base.left = child_node;
		else
			child_parent->base.right = child_node;
	}

	if (child_node != NULL) {
		((PTreeRBNode *) child_node)->parent = child_parent;

		/* Check if we need to repaint the node */
		if (pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
				((PTreeRBNode *) child_node)->color = P_TREE_RB_COLOR_BLACK;
	}

	/* Free unused node */
	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}